

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestIpV4::testComparsion(TestIpV4 *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  test_info *ptVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  string report;
  ostringstream ostr;
  char local_1a8 [360];
  IpV4 local_40 [4];
  IpV4 local_3c [4];
  IpV4 local_38 [4];
  IpV4 local_34 [4];
  
  if ((testComparsion(std::__cxx11::string_const&)::testee == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::testee), iVar5 != 0)
     ) {
    _ostr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"192.168.0.1","");
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,(string *)&ostr);
    if (_ostr != local_1a8) {
      operator_delete(_ostr);
    }
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::testee);
  }
  if ((testComparsion(std::__cxx11::string_const&)::localhost == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::localhost),
     iVar5 != 0)) {
    _ostr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"localhost","");
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::localhost,(string *)&ostr);
    if (_ostr != local_1a8) {
      operator_delete(_ostr);
    }
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::localhost);
  }
  if ((testComparsion(std::__cxx11::string_const&)::lower == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::lower), iVar5 != 0))
  {
    _ostr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"192.167.0.1","");
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,(string *)&ostr);
    if (_ostr != local_1a8) {
      operator_delete(_ostr);
    }
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::lower);
  }
  if ((testComparsion(std::__cxx11::string_const&)::higher == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::higher), iVar5 != 0)
     ) {
    _ostr = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"193.0.0.0","");
    IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher,(string *)&ostr);
    if (_ostr != local_1a8) {
      operator_delete(_ostr);
    }
    __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::higher);
  }
  report._M_dataplus._M_p._0_4_ = 0xc0a80001;
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::testee,
             (string *)&ostr,"0xC0A80001","testee.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd0);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  report._M_dataplus._M_p._0_4_ = 0x7f000001;
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,
             &testComparsion(std::__cxx11::string_const&)::localhost,(string *)&ostr,"0x7F000001U",
             "localhost.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd1);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  report._M_dataplus._M_p._0_4_ = 0xc0a70001;
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::lower,
             (string *)&ostr,"0xC0A70001","lower.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd2);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  report._M_dataplus._M_p._0_4_ = 0xc1000000;
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::higher,
             (string *)&ostr,"0xC1000000","higher.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd3);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  paVar1 = &report.field_2;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"192.168.0.","");
  IpV4::IpV4(local_34,(string *)&ostr);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"expected an exception to be thrown but catchall caught nothing",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"192.168.0.\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd4);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)report._M_dataplus._M_p != paVar1) {
    operator_delete(report._M_dataplus._M_p);
  }
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"0.0.0.257","");
  IpV4::IpV4(local_38,(string *)&ostr);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"expected an exception to be thrown but catchall caught nothing",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"0.0.0.257\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd5);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)report._M_dataplus._M_p != paVar1) {
    operator_delete(report._M_dataplus._M_p);
  }
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"-1.0.0.254","");
  IpV4::IpV4(local_3c,(string *)&ostr);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"expected an exception to be thrown but catchall caught nothing",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"-1.0.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd6);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)report._M_dataplus._M_p != paVar1) {
    operator_delete(report._M_dataplus._M_p);
  }
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"192.d.0.254","");
  IpV4::IpV4(local_40,(string *)&ostr);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"expected an exception to be thrown but catchall caught nothing",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"192.d.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd7);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)report._M_dataplus._M_p != paVar1) {
    operator_delete(report._M_dataplus._M_p);
  }
  bVar4 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee);
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar4,(string *)&ostr,"lower < testee",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd8);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  bVar4 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher);
  ptVar2 = (this->super_test_base<TestIpV4>).super_test_root.m_current_test_info;
  pcVar3 = (ptVar2->m_test_name)._M_dataplus._M_p;
  _ostr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ostr,pcVar3,pcVar3 + (ptVar2->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,bVar4,(string *)&ostr,"testee < higher",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd9);
  if (_ostr != local_1a8) {
    operator_delete(_ostr);
  }
  return;
}

Assistant:

void testComparsion(const std::string&)
    {
        static const IpV4 testee {"192.168.0.1"};
        static const IpV4 localhost {"localhost"};
        static const IpV4 lower {"192.167.0.1"};
        static const IpV4 higher {"193.0.0.0"};

        fructose_assert_eq(0xC0A80001, testee.value);
        fructose_assert_eq(0x7F000001U, localhost.value);
        fructose_assert_eq(0xC0A70001, lower.value);
        fructose_assert_eq(0xC1000000, higher.value);
        fructose_assert_exception(IpV4 {"192.168.0."}, std::runtime_error);     // too short
        fructose_assert_exception(IpV4 {"0.0.0.257"}, std::runtime_error);      // too high
        fructose_assert_exception(IpV4 {"-1.0.0.254"}, std::runtime_error);     // too low
        fructose_assert_exception(IpV4 {"192.d.0.254"}, std::runtime_error);    // invalid
        fructose_assert(lower < testee);
        fructose_assert(testee < higher);
    }